

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O1

void __thiscall
soul::heart::Printer::PrinterStream::printEndpointReference
          (PrinterStream *this,EndpointReference *e)

{
  ProcessorInstance *pPVar1;
  CodePrinter *pCVar2;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  
  pPVar1 = (e->processor).object;
  if (pPVar1 != (ProcessorInstance *)0x0) {
    pCVar2 = this->out;
    text._M_str = (pPVar1->instanceName)._M_dataplus._M_p;
    text._M_len = (pPVar1->instanceName)._M_string_length;
    choc::text::CodePrinter::writeBlock(pCVar2,text);
    text_00._M_str = ".";
    text_00._M_len = 1;
    choc::text::CodePrinter::writeBlock(pCVar2,text_00);
  }
  text_01._M_str = (e->endpointName)._M_dataplus._M_p;
  text_01._M_len = (e->endpointName)._M_string_length;
  choc::text::CodePrinter::writeBlock(this->out,text_01);
  if ((e->endpointIndex).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == true) {
    pCVar2 = this->out;
    text_02._M_str = "[";
    text_02._M_len = 1;
    choc::text::CodePrinter::writeBlock(pCVar2,text_02);
    pCVar2 = choc::text::CodePrinter::operator<<
                       (pCVar2,(e->endpointIndex).super__Optional_base<unsigned_long,_true,_true>.
                               _M_payload.super__Optional_payload_base<unsigned_long>._M_payload.
                               _M_value);
    text_03._M_str = "]";
    text_03._M_len = 1;
    choc::text::CodePrinter::writeBlock(pCVar2,text_03);
    return;
  }
  return;
}

Assistant:

void printEndpointReference (const heart::EndpointReference& e)
        {
            if (e.processor != nullptr)
                out << e.processor->instanceName << ".";

            out << e.endpointName;

            if (e.endpointIndex)
                out << "[" << *e.endpointIndex << "]";
        }